

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O3

void * internal_memalign(mstate m,size_t alignment,size_t bytes)

{
  byte *pbVar1;
  void *pvVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  ulong psize;
  mstate pmVar6;
  mstate pmVar7;
  mstate pmVar8;
  mchunkptr p;
  ulong uVar9;
  
  if (m < (mstate)0x21) {
    m = (mstate)&DAT_00000020;
  }
  pmVar7 = (mstate)&DAT_00000020;
  pmVar6 = m;
  if (((ulong)m & (ulong)((long)&m[-1].exts + 7U)) != 0) {
    do {
      pmVar6 = pmVar7;
      pmVar7 = (mstate)((long)pmVar6 * 2);
    } while (pmVar6 < m);
  }
  if (alignment < -(long)pmVar6 - 0x80U) {
    uVar9 = 0x20;
    if (0x16 < alignment) {
      uVar9 = alignment + 0x17 & 0xfffffffffffffff0;
    }
    pvVar2 = dlmalloc((long)pmVar6->smallbins + (uVar9 - 0x30));
    if (pvVar2 != (void *)0x0) {
      pmVar7 = (mstate)((long)pvVar2 + -0x10);
      if (((ulong)((long)&pmVar6[-1].exts + 7U) & (ulong)pvVar2) != 0) {
        uVar5 = -(long)pmVar6 & (ulong)((undefined1 *)((long)pvVar2 + (long)pmVar6) + -1);
        pmVar8 = (mstate)0x0;
        if ((uVar5 - 0x10) - (long)pmVar7 < 0x20) {
          pmVar8 = pmVar6;
        }
        pmVar6 = (mstate)((long)pmVar8->smallbins + (uVar5 - 0x58));
        p = (mchunkptr)((long)pmVar6 - (long)pmVar7);
        uVar4 = (*(ulong *)((long)pvVar2 + -8) & 0xfffffffffffffff8) - (long)p;
        if ((*(ulong *)((long)pvVar2 + -8) & 3) == 0) {
          *(long *)pmVar6 = (long)&p->prev_foot + *(long *)pmVar7;
          *(ulong *)((long)pmVar8->smallbins + (uVar5 - 0x50)) = uVar4;
          pmVar7 = pmVar6;
        }
        else {
          psize = (uint)*(undefined8 *)((long)pmVar8->smallbins + (uVar5 - 0x50)) & 1 | uVar4 | 2;
          *(ulong *)((long)pmVar8->smallbins + (uVar5 - 0x50)) = psize;
          pbVar1 = (byte *)((long)pmVar8 + uVar4 + (uVar5 - 8));
          *pbVar1 = *pbVar1 | 1;
          *(ulong *)((long)pvVar2 + -8) =
               (ulong)((uint)*(undefined8 *)((long)pvVar2 + -8) & 1) | (ulong)p | 2;
          pbVar1 = (byte *)((long)pvVar2 + -8 + (long)p);
          *pbVar1 = *pbVar1 | 1;
          dispose_chunk(pmVar7,p,psize);
          pmVar7 = pmVar6;
        }
      }
      uVar5 = pmVar7->dvsize;
      if ((uVar5 & 3) != 0) {
        uVar4 = uVar5 & 0xfffffffffffffff8;
        if (uVar9 + 0x20 < uVar4) {
          pmVar7->dvsize = ((uint)uVar5 & 1) + uVar9 + 2;
          *(ulong *)((long)pmVar7->smallbins + (uVar9 - 0x40)) = uVar4 - uVar9 | 3;
          pbVar1 = (byte *)((long)pmVar7->smallbins + (uVar4 - 0x40));
          *pbVar1 = *pbVar1 | 1;
          dispose_chunk((mstate)((long)pmVar7->smallbins + (uVar9 - 0x48)),
                        (mchunkptr)(uVar4 - uVar9),uVar9 + 0x20);
        }
      }
      return &pmVar7->topsize;
    }
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0xc;
  }
  return (void *)0x0;
}

Assistant:

static void* internal_memalign(mstate m, size_t alignment, size_t bytes) {
  void* mem = 0;
  if (alignment <  MIN_CHUNK_SIZE) /* must be at least a minimum chunk size */
    alignment = MIN_CHUNK_SIZE;
  if ((alignment & (alignment-SIZE_T_ONE)) != 0) {/* Ensure a power of 2 */
    size_t a = MALLOC_ALIGNMENT << 1;
    while (a < alignment) a <<= 1;
    alignment = a;
  }
  if (bytes >= MAX_REQUEST - alignment) {
    if (m != 0)  { /* Test isn't needed but avoids compiler warning */
      MALLOC_FAILURE_ACTION;
    }
  }
  else {
    size_t nb = request2size(bytes);
    size_t req = nb + alignment + MIN_CHUNK_SIZE - CHUNK_OVERHEAD;
    mem = internal_malloc(m, req);
    if (mem != 0) {
      mchunkptr p = mem2chunk(mem);
      if (PREACTION(m))
        return 0;
      if ((((size_t)(mem)) & (alignment - 1)) != 0) { /* misaligned */
        /*
          Find an aligned spot inside chunk.  Since we need to give
          back leading space in a chunk of at least MIN_CHUNK_SIZE, if
          the first calculation places us at a spot with less than
          MIN_CHUNK_SIZE leader, we can move to the next aligned spot.
          We've allocated enough total room so that this is always
          possible.
        */
        char* br = (char*)mem2chunk((size_t)(((size_t)((char*)mem + alignment -
                                                       SIZE_T_ONE)) &
                                             -alignment));
        char* pos = ((size_t)(br - (char*)(p)) >= MIN_CHUNK_SIZE)?
          br : br+alignment;
        mchunkptr newp = (mchunkptr)pos;
        size_t leadsize = pos - (char*)(p);
        size_t newsize = chunksize(p) - leadsize;

        if (is_mmapped(p)) { /* For mmapped chunks, just adjust offset */
          newp->prev_foot = p->prev_foot + leadsize;
          newp->head = newsize;
        }
        else { /* Otherwise, give back leader, use the rest */
          set_inuse(m, newp, newsize);
          set_inuse(m, p, leadsize);
          dispose_chunk(m, p, leadsize);
        }
        p = newp;
      }

      /* Give back spare room at the end */
      if (!is_mmapped(p)) {
        size_t size = chunksize(p);
        if (size > nb + MIN_CHUNK_SIZE) {
          size_t remainder_size = size - nb;
          mchunkptr remainder = chunk_plus_offset(p, nb);
          set_inuse(m, p, nb);
          set_inuse(m, remainder, remainder_size);
          dispose_chunk(m, remainder, remainder_size);
        }
      }

      mem = chunk2mem(p);
      assert (chunksize(p) >= nb);
      assert(((size_t)mem & (alignment - 1)) == 0);
      check_inuse_chunk(m, p);
      POSTACTION(m);
    }
  }
  return mem;
}